

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O0

void gdImageWBMPCtx(gdImagePtr image,int fg,gdIOCtx *out)

{
  int iVar1;
  Wbmp *wbmp_00;
  Wbmp *wbmp;
  int local_28;
  int pos;
  int y;
  int x;
  gdIOCtx *out_local;
  int fg_local;
  gdImagePtr image_local;
  
  wbmp_00 = createwbmp(image->sx,image->sy,1);
  if (wbmp_00 == (Wbmp *)0x0) {
    gd_error("Could not create WBMP\n");
  }
  else {
    wbmp._4_4_ = 0;
    for (local_28 = 0; local_28 < image->sy; local_28 = local_28 + 1) {
      for (pos = 0; pos < image->sx; pos = pos + 1) {
        iVar1 = gdImageGetPixel(image,pos,local_28);
        if (iVar1 == fg) {
          wbmp_00->bitmap[wbmp._4_4_] = 0;
        }
        wbmp._4_4_ = wbmp._4_4_ + 1;
      }
    }
    iVar1 = writewbmp(wbmp_00,gd_putout,out);
    if (iVar1 != 0) {
      gd_error("Could not save WBMP\n");
    }
    freewbmp(wbmp_00);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageWBMPCtx(gdImagePtr image, int fg, gdIOCtx *out)
{
	int x, y, pos;
	Wbmp *wbmp;

	/* create the WBMP */
	if((wbmp = createwbmp(gdImageSX(image), gdImageSY(image), WBMP_WHITE)) == NULL) {
		gd_error("Could not create WBMP\n");
		return;
	}

	/* fill up the WBMP structure */
	pos = 0;
	for(y = 0; y < gdImageSY(image); y++) {
		for(x = 0; x < gdImageSX(image); x++) {
			if(gdImageGetPixel(image, x, y) == fg) {
				wbmp->bitmap[pos] = WBMP_BLACK;
			}
			pos++;
		}
	}

	/* write the WBMP to a gd file descriptor */
	if(writewbmp(wbmp, &gd_putout, out)) {
		gd_error("Could not save WBMP\n");
	}

	/* des submitted this bugfix: gdFree the memory. */
	freewbmp(wbmp);
}